

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O3

ProgramContext * __thiscall
deqp::gles3::Performance::anon_unknown_1::FunctionCase::generateSingleProgramData
          (ProgramContext *__return_storage_ptr__,FunctionCase *this,ProgramID programID)

{
  ulong uVar1;
  DataType *pDVar2;
  FunctionCase *pFVar3;
  int iVar4;
  int iVar5;
  DataType DVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  ostream *poVar10;
  long *plVar11;
  ProgramContext *extraout_RAX;
  ProgramContext *pPVar12;
  pointer pAVar13;
  long *plVar14;
  size_type *psVar15;
  ulong *puVar16;
  long lVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  char cVar22;
  uint uVar23;
  long lVar24;
  int i;
  string *this_00;
  int iVar25;
  ostringstream *poVar26;
  string incExpr;
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  attributes;
  string inputName;
  string returnPrecisionMaybe;
  string swizzle;
  char *paramTypeNames [3];
  string paramPrecisionsMaybe [3];
  ostringstream vtx;
  ostringstream frag;
  string local_708;
  char local_6e1;
  char *local_6e0;
  string local_6d8;
  FunctionCase *local_6b8;
  CaseType local_6b0;
  uint local_6ac;
  ulong local_6a8;
  ostringstream *local_6a0;
  undefined1 local_698 [24];
  long lStack_680;
  AttribSpec local_670;
  char *local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_608;
  ulong local_600;
  ProgramID local_5f4;
  Vec4 local_5f0;
  ulong local_5e0;
  long lStack_5d8;
  char *local_5d0;
  Vec4 local_5c8;
  ulong local_5b8 [2];
  Vec4 local_5a8;
  undefined1 local_598;
  undefined7 uStack_597;
  ProgramContext *local_588;
  long local_580;
  undefined1 local_578 [80];
  undefined1 local_528 [8];
  undefined8 local_520;
  undefined1 local_518 [96];
  ios_base local_4b8 [264];
  ProgramContext *local_3b0;
  undefined8 auStack_3a8 [4];
  string local_388 [8];
  string local_380 [8];
  string local_378 [48];
  long local_348 [5];
  undefined1 local_320 [112];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [376];
  
  local_6b0 = (this->super_OperatorPerformanceCase).m_caseType;
  local_5f4 = programID;
  local_3b0 = __return_storage_ptr__;
  pcVar7 = glu::getPrecisionName(this->m_precision);
  local_610 = glu::getDataTypeName(this->m_returnType);
  local_6b8 = this;
  local_5d0 = pcVar7;
  if (this->m_returnType - TYPE_BOOL < 4) {
    local_588 = (ProgramContext *)local_578;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,0x1aee929);
  }
  else {
    local_320._8_8_ = 0;
    local_320[0x10] = 0;
    local_320._0_8_ = local_320 + 0x10;
    plVar11 = (long *)std::__cxx11::string::append(local_320);
    pAVar13 = (pointer)(plVar11 + 2);
    if ((pointer)*plVar11 == pAVar13) {
      local_518._0_8_ = (pAVar13->name)._M_dataplus._M_p;
      local_518._8_8_ = plVar11[3];
      local_528 = (undefined1  [8])local_518;
    }
    else {
      local_518._0_8_ = (pAVar13->name)._M_dataplus._M_p;
      local_528 = (undefined1  [8])*plVar11;
    }
    local_520 = (pointer)plVar11[1];
    *plVar11 = (long)pAVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append(local_528);
    local_588 = (ProgramContext *)local_578;
    pPVar12 = (ProgramContext *)(plVar11 + 2);
    if ((ProgramContext *)*plVar11 == pPVar12) {
      local_578._0_8_ = (pPVar12->vertShaderSource)._M_dataplus._M_p;
      local_578._8_8_ = plVar11[3];
    }
    else {
      local_578._0_8_ = (pPVar12->vertShaderSource)._M_dataplus._M_p;
      local_588 = (ProgramContext *)*plVar11;
    }
    local_580 = plVar11[1];
    *plVar11 = (long)pPVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    if (local_528 != (undefined1  [8])local_518) {
      operator_delete((void *)local_528,(ulong)(local_518._0_8_ + 1));
    }
    if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
      operator_delete((void *)local_320._0_8_,CONCAT71(local_320._17_7_,local_320[0x10]) + 1);
    }
  }
  DVar6 = local_6b8->m_returnType;
  lVar17 = 0x10;
  do {
    *(string **)((long)auStack_3a8 + lVar17 + 0x10) = local_388 + lVar17;
    *(undefined8 *)((long)auStack_3a8 + lVar17 + 0x18) = 0;
    local_388[lVar17] = (string)0x0;
    lVar17 = lVar17 + 0x20;
  } while (lVar17 != 0x70);
  local_6e1 = DVar6 - TYPE_FLOAT_MAT2 < 9 || DVar6 - TYPE_DOUBLE_MAT2 < 9;
  this_00 = local_388;
  uVar19 = 0;
  local_6a8 = 0;
  pcVar7 = (char *)0x0;
  do {
    pFVar3 = local_6b8;
    pcVar8 = glu::getDataTypeName(local_6b8->m_paramTypes[uVar19]);
    auStack_3a8[uVar19] = pcVar8;
    uVar23 = pFVar3->m_paramTypes[uVar19] - TYPE_BOOL;
    if (uVar23 < 4) {
      local_528 = (undefined1  [8])local_518;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_528,0x1aee929);
    }
    else {
      local_578._16_8_ = local_578 + 0x20;
      local_578._24_8_ = 0;
      local_578[0x20] = 0;
      plVar11 = (long *)std::__cxx11::string::append(local_578 + 0x10);
      plVar14 = plVar11 + 2;
      if ((long *)*plVar11 == plVar14) {
        local_578._64_8_ = *plVar14;
        local_578._72_8_ = plVar11[3];
        local_578._48_8_ = local_578 + 0x40;
      }
      else {
        local_578._64_8_ = *plVar14;
        local_578._48_8_ = (long *)*plVar11;
      }
      local_578._56_8_ = plVar11[1];
      *plVar11 = (long)plVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append(local_578 + 0x30);
      local_528 = (undefined1  [8])local_518;
      pAVar13 = (pointer)(plVar11 + 2);
      if ((pointer)*plVar11 == pAVar13) {
        local_518._0_8_ = (pAVar13->name)._M_dataplus._M_p;
        local_518._8_8_ = plVar11[3];
      }
      else {
        local_518._0_8_ = (pAVar13->name)._M_dataplus._M_p;
        local_528 = (undefined1  [8])*plVar11;
      }
      local_520 = (pointer)plVar11[1];
      *plVar11 = (long)pAVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
    }
    std::__cxx11::string::operator=(this_00,(string *)local_528);
    if (local_528 != (undefined1  [8])local_518) {
      operator_delete((void *)local_528,(ulong)(local_518._0_8_ + 1));
    }
    if (3 < uVar23) {
      if ((undefined1 *)local_578._48_8_ != local_578 + 0x40) {
        operator_delete((void *)local_578._48_8_,
                        (ulong)((long)&(((string *)local_578._64_8_)->_M_dataplus)._M_p + 1));
      }
      if ((undefined1 *)local_578._16_8_ != local_578 + 0x20) {
        operator_delete((void *)local_578._16_8_,CONCAT71(local_578._33_7_,local_578[0x20]) + 1);
      }
    }
    pDVar2 = local_6b8->m_paramTypes + uVar19;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = (char *)0x0;
      if (local_6b8->m_precision == PRECISION_LOWP) {
        pcVar7 = "mediump";
      }
      if (3 < *pDVar2 - TYPE_INT) {
        pcVar7 = (char *)0x0;
      }
    }
    uVar19 = uVar19 + 1;
    if (*pDVar2 != TYPE_INVALID) {
      local_6a8 = uVar19;
    }
    local_6a8 = local_6a8 & 0xffffffff;
    this_00 = this_00 + 0x20;
  } while (uVar19 != 3);
  if (pcVar7 == (char *)0x0) {
    pcVar7 = local_5d0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  poVar26 = (ostringstream *)local_1a8;
  if (local_6b0 == CASETYPE_VERTEX) {
    poVar26 = (ostringstream *)local_320;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout (location = 0) out mediump vec4 o_color;\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"in highp vec4 a_position;\n",0x1a);
  local_6ac = (int)local_6a8 + 3;
  if ((int)local_6ac < 1) {
    if (local_6b0 != CASETYPE_VERTEX) goto LAB_0136d39e;
  }
  else {
    uVar23 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"in ",3);
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)&local_708 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 1000);
      }
      else {
        sVar9 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar7,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," vec4 a_in",10);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_320,uVar23);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
      uVar23 = uVar23 + 1;
    } while (local_6ac != uVar23);
    if (local_6b0 != CASETYPE_VERTEX) {
      if (0 < (int)local_6ac) {
        uVar23 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"out ",4);
          if (pcVar7 == (char *)0x0) {
            std::ios::clear((int)&local_708 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 1000);
          }
          else {
            sVar9 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar7,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," vec4 v_in",10);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_320,uVar23);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
          if (pcVar7 == (char *)0x0) {
            std::ios::clear((int)&local_708 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x560)
            ;
          }
          else {
            sVar9 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," vec4 v_in",10);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,uVar23);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
          uVar23 = uVar23 + 1;
        } while (local_6ac != uVar23);
      }
      goto LAB_0136d39e;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"out mediump vec4 v_color;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"in mediump vec4 v_color;\n",0x19);
LAB_0136d39e:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar26,"uniform mediump int u_numLoopIterations;\n",0x29);
  if (local_6b0 == CASETYPE_VERTEX) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"uniform mediump float u_zero;\n",0x1e);
  }
  local_600 = local_6a8 & 0xffffffff;
  if (0 < (int)local_6a8) {
    lVar17 = local_600 * 8;
    cVar22 = 'A';
    lVar24 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,"uniform ",8);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar26,*(char **)(local_388 + lVar24 * 4),
                           *(long *)(local_378 + lVar24 * 4 + -8));
      pcVar7 = *(char **)((long)auStack_3a8 + lVar24);
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
      }
      else {
        sVar9 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar7,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," u_inc",6);
      local_528[0] = cVar22;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_528,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
      cVar22 = cVar22 + '\x01';
      lVar24 = lVar24 + 8;
    } while (lVar17 - lVar24 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"{\n",2);
  if (local_6b0 != CASETYPE_VERTEX) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"\tgl_Position = a_position;\n",0x1b);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  local_6e0 = "v_";
  if (local_6b0 == CASETYPE_VERTEX) {
    local_6e0 = "a_";
  }
  pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_6a0 = poVar26;
  do {
    local_608 = pbVar18;
    if (0 < (int)local_6a8) {
      uVar19 = 0;
      do {
        DVar6 = local_6b8->m_paramTypes[uVar19];
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,"\t",1);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar26,*(char **)(local_388 + uVar19 * 0x20),
                             *(long *)(local_378 + uVar19 * 0x20 + -8));
        pcVar7 = (char *)auStack_3a8[uVar19];
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
        }
        else {
          sVar9 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar7,sVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," in",3);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)pbVar18);
        local_528[0] = (char)uVar19 + 'a';
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_528,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
        if (DVar6 == TYPE_FLOAT_VEC4) {
LAB_0136d774:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,local_6e0,2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,"in",2);
          std::ostream::operator<<(poVar26,(int)pbVar18 + (int)uVar19);
          if (uVar19 == (uint)local_6b8->m_modifyParamNdx) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26," + 2.0",6);
          }
        }
        else {
          if (pcVar7 == (char *)0x0) {
            std::ios::clear((int)poVar26 + (int)*(undefined8 *)(*(long *)poVar26 + -0x18));
          }
          else {
            sVar9 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,pcVar7,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,"(",1);
          if (8 < DVar6 - TYPE_FLOAT_MAT2 && 8 < DVar6 - TYPE_DOUBLE_MAT2) goto LAB_0136d774;
          iVar4 = glu::getDataTypeMatrixNumRows(DVar6);
          iVar5 = glu::getDataTypeMatrixNumColumns(DVar6);
          if (iVar4 < 4) {
            local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
            local_708._M_string_length = 0;
            local_708.field_2._M_allocated_capacity =
                 local_708.field_2._M_allocated_capacity & 0xffffffffffffff00;
            plVar11 = (long *)std::__cxx11::string::append((char *)&local_708);
            local_670.name._M_dataplus._M_p = (pointer)&local_670.name.field_2;
            psVar15 = (size_type *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_670.name.field_2._M_allocated_capacity = *psVar15;
              local_670.name.field_2._8_8_ = plVar11[3];
            }
            else {
              local_670.name.field_2._M_allocated_capacity = *psVar15;
              local_670.name._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_670.name._M_string_length = plVar11[1];
            *plVar11 = (long)psVar15;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            plVar11 = (long *)std::__cxx11::string::append((char *)&local_670);
            local_528 = (undefined1  [8])local_518;
            pAVar13 = (pointer)(plVar11 + 2);
            if ((pointer)*plVar11 == pAVar13) {
              local_518._0_8_ = (pAVar13->name)._M_dataplus._M_p;
              local_518._8_8_ = plVar11[3];
            }
            else {
              local_518._0_8_ = (pAVar13->name)._M_dataplus._M_p;
              local_528 = (undefined1  [8])*plVar11;
            }
            local_520 = (pointer)plVar11[1];
            *plVar11 = (long)pAVar13;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_670.name._M_dataplus._M_p != &local_670.name.field_2) {
              operator_delete(local_670.name._M_dataplus._M_p,
                              local_670.name.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_708._M_dataplus._M_p != &local_708.field_2) {
              operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            local_528 = (undefined1  [8])local_518;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_528,0x1aee929);
          }
          if (0 < iVar5) {
            iVar4 = (int)local_608;
            iVar25 = 0;
            do {
              poVar26 = local_6a0;
              pcVar7 = " , ";
              if (iVar25 == 0) {
                pcVar7 = glcts::fixed_sample_locations_values;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_6a0,(bool *)pcVar7 + 1,(ulong)((uint)(iVar25 != 0) * 2));
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,local_6e0,2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,"in",2);
              poVar10 = (ostream *)std::ostream::operator<<(poVar26,iVar4 + (int)uVar19);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)local_528,(long)local_520);
              iVar25 = iVar25 + 1;
            } while (iVar5 != iVar25);
          }
          pbVar18 = local_608;
          poVar26 = local_6a0;
          if (local_528 != (undefined1  [8])local_518) {
            operator_delete((void *)local_528,(ulong)(local_518._0_8_ + 1));
            pbVar18 = local_608;
            poVar26 = local_6a0;
          }
        }
        if (DVar6 != TYPE_FLOAT_VEC4) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,")",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,";\n",2);
        uVar19 = uVar19 + 1;
      } while (uVar19 != local_600);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,"\t",1);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar26,(char *)local_588,local_580);
    pcVar7 = local_610;
    if (local_610 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
    }
    else {
      sVar9 = strlen(local_610);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar7,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," res",4);
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_608);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
    pcVar7 = local_610;
    if (local_610 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
    }
    else {
      sVar9 = strlen(local_610);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar7,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(0);\n",5);
    pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)local_608 + 1);
  } while (pbVar18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar26,"\tfor (int i = 0; i < u_numLoopIterations; i++)\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,"\t{\n",3);
  local_608 = &local_6b8->m_func;
  uVar19 = 0;
  do {
    local_6e0 = (char *)uVar19;
    if ((int)uVar19 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,"\t\t{\n",4);
    if (0 < (int)local_6a8) {
      uVar19 = 0;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
        std::ostream::operator<<((string *)local_528,(int)local_6e0);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
        std::ios_base::~ios_base(local_4b8);
        plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_6d8,0,(char *)0x0,0x1c3b6d3);
        local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
        psVar15 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_708.field_2._M_allocated_capacity = *psVar15;
          local_708.field_2._8_8_ = plVar11[3];
        }
        else {
          local_708.field_2._M_allocated_capacity = *psVar15;
          local_708._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_708._M_string_length = plVar11[1];
        *plVar11 = (long)psVar15;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::_M_replace_aux
                                    ((ulong)&local_708,local_708._M_string_length,0,'\x01');
        local_670.name._M_dataplus._M_p = (pointer)&local_670.name.field_2;
        psVar15 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_670.name.field_2._M_allocated_capacity = *psVar15;
          local_670.name.field_2._8_8_ = plVar11[3];
        }
        else {
          local_670.name.field_2._M_allocated_capacity = *psVar15;
          local_670.name._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_670.name._M_string_length = plVar11[1];
        *plVar11 = (long)psVar15;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_708._M_dataplus._M_p != &local_708.field_2) {
          operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
          operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
        }
        local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
        local_6d8._M_string_length = 0;
        local_6d8.field_2._M_allocated_capacity =
             local_6d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_6d8);
        local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
        puVar16 = (ulong *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar16) {
          local_708.field_2._M_allocated_capacity = *puVar16;
          local_708.field_2._8_8_ = plVar11[3];
        }
        else {
          local_708.field_2._M_allocated_capacity = *puVar16;
          local_708._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_708._M_string_length = plVar11[1];
        *plVar11 = (long)puVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::_M_replace_aux
                                    ((ulong)&local_708,local_708._M_string_length,0,'\x01');
        local_528 = (undefined1  [8])local_518;
        pAVar13 = (pointer)(plVar11 + 2);
        if ((pointer)*plVar11 == pAVar13) {
          local_518._0_8_ = (pAVar13->name)._M_dataplus._M_p;
          local_518._8_8_ = plVar11[3];
        }
        else {
          local_518._0_8_ = (pAVar13->name)._M_dataplus._M_p;
          local_528 = (undefined1  [8])*plVar11;
        }
        local_520 = (pointer)plVar11[1];
        *plVar11 = (long)pAVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_708._M_dataplus._M_p != &local_708.field_2) {
          operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
          operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
        }
        incrementExpr(&local_708,(string *)local_528,local_6b8->m_paramTypes[uVar19],
                      local_6b8->m_useNearlyConstantInputs);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,"\t\t\t",3);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar26,local_670.name._M_dataplus._M_p,
                             local_670.name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
        sumExpr(&local_6d8,&local_670.name,&local_708,local_6b8->m_paramTypes[uVar19]);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,local_6d8._M_dataplus._M_p,local_6d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
          operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_708._M_dataplus._M_p != &local_708.field_2) {
          operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1);
        }
        if (local_528 != (undefined1  [8])local_518) {
          operator_delete((void *)local_528,(ulong)(local_518._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_670.name._M_dataplus._M_p != &local_670.name.field_2) {
          operator_delete(local_670.name._M_dataplus._M_p,
                          local_670.name.field_2._M_allocated_capacity + 1);
        }
        uVar19 = uVar19 + 1;
      } while (local_600 != uVar19);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,"\t\t\t",3);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar26,(char *)local_588,local_580);
    pcVar7 = local_610;
    if (local_610 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
    }
    else {
      sVar9 = strlen(local_610);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar7,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," eval",5);
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_6e0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
    pcVar7 = local_610;
    if (local_5f4 == PROGRAM_WITH_FUNCTION_CALLS) {
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar26,(local_6b8->m_func)._M_dataplus._M_p,
                           (local_6b8->m_func)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
      lVar17 = 1;
      if ((int)local_6a8 < 1) {
        pcVar7 = ")";
      }
      else {
        iVar4 = 0;
        do {
          if (iVar4 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6a0,", ",2);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6a0,"in",2);
          poVar10 = (ostream *)std::ostream::operator<<(local_6a0,(int)local_6e0);
          local_528[0] = (char)iVar4 + 'a';
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_528,1);
          iVar4 = iVar4 + 1;
        } while ((int)local_6a8 != iVar4);
        pcVar7 = ")";
        poVar26 = local_6a0;
      }
    }
    else if (local_610 == (char *)0x0) {
      lVar17 = 3;
      std::ios::clear((int)poVar26 + (int)*(undefined8 *)(*(long *)poVar26 + -0x18));
      pcVar7 = "(1)";
    }
    else {
      sVar9 = strlen(local_610);
      lVar17 = 3;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,pcVar7,sVar9);
      pcVar7 = "(1)";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,pcVar7,lVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,";\n",2);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
    std::ostream::operator<<((string *)local_528,(int)local_6e0);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
    std::ios_base::~ios_base(local_4b8);
    plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_708,0,(char *)0x0,0x1bd9413);
    local_670.name._M_dataplus._M_p = (pointer)&local_670.name.field_2;
    psVar15 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_670.name.field_2._M_allocated_capacity = *psVar15;
      local_670.name.field_2._8_8_ = plVar11[3];
    }
    else {
      local_670.name.field_2._M_allocated_capacity = *psVar15;
      local_670.name._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_670.name._M_string_length = plVar11[1];
    *plVar11 = (long)psVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_708._M_dataplus._M_p != &local_708.field_2) {
      operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
    std::ostream::operator<<((string *)local_528,(int)local_6e0);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
    std::ios_base::~ios_base(local_4b8);
    plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_6d8,0,(char *)0x0,0x1bd940b);
    local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
    puVar16 = (ulong *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_708.field_2._M_allocated_capacity = *puVar16;
      local_708.field_2._8_8_ = plVar11[3];
    }
    else {
      local_708.field_2._M_allocated_capacity = *puVar16;
      local_708._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_708._M_string_length = plVar11[1];
    *plVar11 = (long)puVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
      operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
    }
    incrementExpr((string *)local_528,&local_708,local_6b8->m_returnType,
                  local_6b8->m_useNearlyConstantInputs);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,"\t\t\tres",6);
    poVar10 = (ostream *)std::ostream::operator<<(poVar26,(int)local_6e0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
    sumExpr(&local_6d8,&local_670.name,(string *)local_528,local_6b8->m_returnType);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_6d8._M_dataplus._M_p,local_6d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
      operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
    }
    if (local_528 != (undefined1  [8])local_518) {
      operator_delete((void *)local_528,(ulong)(local_518._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_708._M_dataplus._M_p != &local_708.field_2) {
      operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670.name._M_dataplus._M_p != &local_670.name.field_2) {
      operator_delete(local_670.name._M_dataplus._M_p,
                      local_670.name.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,"\t\t}\n",4);
    uVar23 = (int)local_6e0 + 1;
    uVar19 = (ulong)uVar23;
  } while (uVar23 != 4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,"\t}\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,"\n",1);
  if (0 < (int)local_6a8) {
    local_6e0 = (char *)0x0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,"\t",1);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar26,*(char **)(local_388 + (long)local_6e0 * 0x20),
                           *(long *)(local_378 + (long)local_6e0 * 0x20 + -8));
      pcVar7 = (char *)auStack_3a8[(long)local_6e0];
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
      }
      else {
        sVar9 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar7,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," sumIn",6);
      local_528[0] = (char)local_6e0 + 'A';
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_528,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
      local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
      local_708._M_string_length = 0;
      local_708.field_2._M_allocated_capacity =
           local_708.field_2._M_allocated_capacity & 0xffffffffffffff00;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_708);
      local_528 = (undefined1  [8])local_518;
      pAVar13 = (pointer)(plVar11 + 2);
      if ((pointer)*plVar11 == pAVar13) {
        local_518._0_8_ = (pAVar13->name)._M_dataplus._M_p;
        local_518._8_8_ = plVar11[3];
      }
      else {
        local_518._0_8_ = (pAVar13->name)._M_dataplus._M_p;
        local_528 = (undefined1  [8])*plVar11;
      }
      local_520 = (pointer)plVar11[1];
      *plVar11 = (long)pAVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::_M_replace_aux
                                  ((ulong)local_528,(ulong)local_520,0,'\x01');
      local_670.name._M_dataplus._M_p = (pointer)&local_670.name.field_2;
      psVar15 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_670.name.field_2._M_allocated_capacity = *psVar15;
        local_670.name.field_2._8_8_ = plVar11[3];
      }
      else {
        local_670.name.field_2._M_allocated_capacity = *psVar15;
        local_670.name._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_670.name._M_string_length = plVar11[1];
      *plVar11 = (long)psVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if (local_528 != (undefined1  [8])local_518) {
        operator_delete((void *)local_528,(ulong)(local_518._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_708._M_dataplus._M_p != &local_708.field_2) {
        operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1);
      }
      iVar4 = 1;
      do {
        local_5a8.m_data._0_8_ = &local_598;
        local_5a8.m_data[2] = 0.0;
        local_5a8.m_data[3] = 0.0;
        local_598 = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_5a8);
        puVar16 = (ulong *)(plVar11 + 2);
        if ((ulong *)*plVar11 == puVar16) {
          local_5e0 = *puVar16;
          lStack_5d8 = plVar11[3];
          local_5f0.m_data._0_8_ = &local_5e0;
        }
        else {
          local_5e0 = *puVar16;
          local_5f0.m_data._0_8_ = (ulong *)*plVar11;
        }
        local_5f0.m_data._8_8_ = plVar11[1];
        *plVar11 = (long)puVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
        std::ostream::operator<<((ostringstream *)local_528,iVar4);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
        std::ios_base::~ios_base(local_4b8);
        uVar19 = 0xf;
        if ((ulong *)local_5f0.m_data._0_8_ != &local_5e0) {
          uVar19 = local_5e0;
        }
        uVar1 = CONCAT44(local_5c8.m_data[3],local_5c8.m_data[2]) + local_5f0.m_data._8_8_;
        if (uVar19 < uVar1) {
          uVar19 = 0xf;
          if ((ulong *)CONCAT44(local_5c8.m_data[1],local_5c8.m_data[0]) != local_5b8) {
            uVar19 = local_5b8[0];
          }
          if (uVar19 < uVar1) goto LAB_0136e727;
          plVar11 = (long *)std::__cxx11::string::replace
                                      ((ulong)&local_5c8,0,(char *)0x0,local_5f0.m_data._0_8_);
        }
        else {
LAB_0136e727:
          plVar11 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_5f0,
                                       CONCAT44(local_5c8.m_data[1],local_5c8.m_data[0]));
        }
        local_698._0_8_ = local_698 + 0x10;
        pAVar13 = (pointer)(plVar11 + 2);
        if ((pointer)*plVar11 == pAVar13) {
          local_698._16_8_ = (pAVar13->name)._M_dataplus._M_p;
          lStack_680 = plVar11[3];
        }
        else {
          local_698._16_8_ = (pAVar13->name)._M_dataplus._M_p;
          local_698._0_8_ = (pointer)*plVar11;
        }
        local_698._8_8_ = plVar11[1];
        *plVar11 = (long)pAVar13;
        plVar11[1] = 0;
        *(undefined1 *)&(pAVar13->name)._M_dataplus._M_p = 0;
        plVar11 = (long *)std::__cxx11::string::_M_replace_aux
                                    ((ulong)local_698,local_698._8_8_,0,'\x01');
        local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
        puVar16 = (ulong *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar16) {
          local_6d8.field_2._M_allocated_capacity = *puVar16;
          local_6d8.field_2._8_8_ = plVar11[3];
        }
        else {
          local_6d8.field_2._M_allocated_capacity = *puVar16;
          local_6d8._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_6d8._M_string_length = plVar11[1];
        *plVar11 = (long)puVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        sumExpr(&local_708,&local_670.name,&local_6d8,local_6b8->m_paramTypes[(long)local_6e0]);
        std::__cxx11::string::operator=((string *)&local_670,(string *)&local_708);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_708._M_dataplus._M_p != &local_708.field_2) {
          operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
          operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_698._0_8_ != (pointer)(local_698 + 0x10)) {
          operator_delete((void *)local_698._0_8_,
                          (ulong)((long)&(((string *)local_698._16_8_)->_M_dataplus)._M_p + 1));
        }
        if ((ulong *)CONCAT44(local_5c8.m_data[1],local_5c8.m_data[0]) != local_5b8) {
          operator_delete((ulong *)CONCAT44(local_5c8.m_data[1],local_5c8.m_data[0]),
                          local_5b8[0] + 1);
        }
        if ((ulong *)local_5f0.m_data._0_8_ != &local_5e0) {
          operator_delete((void *)local_5f0.m_data._0_8_,local_5e0 + 1);
        }
        if ((undefined1 *)local_5a8.m_data._0_8_ != &local_598) {
          operator_delete((void *)local_5a8.m_data._0_8_,CONCAT71(uStack_597,local_598) + 1);
        }
        iVar4 = iVar4 + 1;
      } while (iVar4 != 4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar26,local_670.name._M_dataplus._M_p,local_670.name._M_string_length)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670.name._M_dataplus._M_p != &local_670.name.field_2) {
        operator_delete(local_670.name._M_dataplus._M_p,
                        local_670.name.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,";\n",2);
      local_6e0 = (char *)((long)local_6e0 + 1);
    } while (local_6e0 != (char *)local_600);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,"\t",1);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar26,(char *)local_588,local_580);
  pcVar7 = local_610;
  if (local_610 == (char *)0x0) {
    std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
  }
  else {
    sVar9 = strlen(local_610);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar7,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," sumRes = ",10);
  local_670.name._M_dataplus._M_p = (pointer)&local_670.name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"res0","");
  iVar4 = 1;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
    std::ostream::operator<<((ostringstream *)local_528,iVar4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
    std::ios_base::~ios_base(local_4b8);
    plVar11 = (long *)std::__cxx11::string::replace((ulong)local_698,0,(char *)0x0,0x1bd9413);
    local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
    puVar16 = (ulong *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_6d8.field_2._M_allocated_capacity = *puVar16;
      local_6d8.field_2._8_8_ = plVar11[3];
    }
    else {
      local_6d8.field_2._M_allocated_capacity = *puVar16;
      local_6d8._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_6d8._M_string_length = plVar11[1];
    *plVar11 = (long)puVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    sumExpr(&local_708,&local_670.name,&local_6d8,local_6b8->m_returnType);
    std::__cxx11::string::operator=((string *)&local_670,(string *)&local_708);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_708._M_dataplus._M_p != &local_708.field_2) {
      operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
      operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_698._0_8_ != (pointer)(local_698 + 0x10)) {
      operator_delete((void *)local_698._0_8_,
                      (ulong)((long)&(((string *)local_698._16_8_)->_M_dataplus)._M_p + 1));
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar26,local_670.name._M_dataplus._M_p,local_670.name._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670.name._M_dataplus._M_p != &local_670.name.field_2) {
    operator_delete(local_670.name._M_dataplus._M_p,local_670.name.field_2._M_allocated_capacity + 1
                   );
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,";\n",2);
  DVar6 = local_6b8->m_returnType;
  iVar4 = (int)poVar26;
  if (DVar6 - TYPE_FLOAT_MAT2 < 9 || DVar6 - TYPE_DOUBLE_MAT2 < 9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,"\t",1);
    pcVar7 = local_5d0;
    if (local_5d0 == (char *)0x0) {
      std::ios::clear(iVar4 + (int)*(undefined8 *)(*(long *)poVar26 + -0x18));
    }
    else {
      sVar9 = strlen(local_5d0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,pcVar7,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26," ",1);
    pcVar7 = local_610;
    if (local_610 == (char *)0x0) {
      std::ios::clear(iVar4 + (int)*(undefined8 *)(*(long *)poVar26 + -0x18));
    }
    else {
      sVar9 = strlen(local_610);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,pcVar7,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26," finalRes = ",0xc);
    if (0 < (int)local_6a8) {
      iVar4 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6a0,"sumIn",5);
        local_528[0] = (char)iVar4 + 'A';
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_6a0,local_528,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," + ",3);
        iVar4 = iVar4 + 1;
      } while ((int)local_6a8 != iVar4);
    }
    poVar26 = local_6a0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6a0,"sumRes;\n",8);
  }
  else {
    iVar5 = glu::getDataTypeScalarSize(DVar6);
    if (0 < (int)local_6a8) {
      uVar19 = 0;
      do {
        iVar25 = glu::getDataTypeScalarSize(local_6b8->m_paramTypes[uVar19]);
        if (iVar25 < iVar5) {
          iVar25 = iVar5;
        }
        iVar5 = iVar25;
        uVar19 = uVar19 + 1;
      } while (local_600 != uVar19);
    }
    DVar6 = TYPE_FLOAT;
    if (iVar5 != 1) {
      DVar6 = glu::getDataTypeFloatVec(iVar5);
    }
    pcVar7 = glu::getDataTypeName(DVar6);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_528,pcVar7,(allocator<char> *)&local_670);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,"\t",1);
    pcVar7 = local_5d0;
    if (local_5d0 == (char *)0x0) {
      std::ios::clear(iVar4 + (int)*(undefined8 *)(*(long *)poVar26 + -0x18));
    }
    else {
      sVar9 = strlen(local_5d0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,pcVar7,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26," ",1);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar26,(char *)local_528,(long)local_520);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," finalRes = ",0xc);
    if (0 < (int)local_6a8) {
      iVar4 = 0;
      do {
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_6a0,(char *)local_528,(long)local_520);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(sumIn",6);
        local_670.name._M_dataplus._M_p._0_1_ = (char)iVar4 + 'A';
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_670,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,") + ",4);
        iVar4 = iVar4 + 1;
      } while ((int)local_6a8 != iVar4);
    }
    poVar26 = local_6a0;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_6a0,(char *)local_528,(long)local_520);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(sumRes);\n",10);
    if (local_528 != (undefined1  [8])local_518) {
      operator_delete((void *)local_528,(ulong)(local_518._0_8_ + 1));
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar26,"\tmediump vec4 color = ",0x16);
  if (DVar6 == TYPE_FLOAT_VEC4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,"finalRes",8);
  }
  else {
    if (local_6e1 == '\0') {
      iVar4 = glu::getDataTypeScalarSize(DVar6);
      local_6e0 = (char *)CONCAT44(local_6e0._4_4_,iVar4);
    }
    else {
      iVar4 = glu::getDataTypeMatrixNumRows(DVar6);
      local_6e0 = (char *)CONCAT44(local_6e0._4_4_,iVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,"vec4(",5);
    if (local_6e1 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,"finalRes",8);
    }
    else {
      for (iVar4 = 0; iVar5 = glu::getDataTypeMatrixNumColumns(DVar6), iVar4 < iVar5;
          iVar4 = iVar4 + 1) {
        if (iVar4 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26," + ",3);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,"finalRes[",9);
        poVar10 = (ostream *)std::ostream::operator<<(poVar26,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
      }
    }
    poVar26 = local_6a0;
    if ((int)local_6e0 < 4) {
      iVar4 = 4 - (int)local_6e0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,", ",2);
        pcVar7 = "0.0";
        if (iVar4 == 1) {
          pcVar7 = "1.0";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,pcVar7,3);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    poVar26 = local_6a0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6a0,")",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,";\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,"\t",1);
  pcVar7 = "o_color";
  if (local_6b0 == CASETYPE_VERTEX) {
    pcVar7 = "v_color";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26,pcVar7,7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar26," = color;\n",10);
  if (local_6b0 == CASETYPE_VERTEX) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"\tgl_Position = a_position + u_zero*color;\n",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\to_color = v_color;\n",0x14);
  }
  else if (0 < (int)local_6ac) {
    uVar23 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\tv_in",5);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_320,uVar23);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," = a_in",7);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,uVar23);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
      uVar23 = uVar23 + 1;
    } while (local_6ac != uVar23);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  local_698._0_8_ = (pointer)0x0;
  local_698._8_8_ = (pointer)0x0;
  local_698._16_8_ = (pointer)0x0;
  if (0 < (int)local_6ac) {
    uVar23 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
      std::ostream::operator<<((ostringstream *)local_528,uVar23);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
      std::ios_base::~ios_base(local_4b8);
      plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_6d8,0,(char *)0x0,0x1ca840f);
      local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
      puVar16 = (ulong *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar16) {
        local_708.field_2._M_allocated_capacity = *puVar16;
        local_708.field_2._8_8_ = plVar11[3];
      }
      else {
        local_708.field_2._M_allocated_capacity = *puVar16;
        local_708._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_708._M_string_length = plVar11[1];
      *plVar11 = (long)puVar16;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      uVar20 = uVar23 + 5;
      if (-1 < (int)(uVar23 + 2)) {
        uVar20 = uVar23 + 2;
      }
      uVar21 = uVar23 + 6;
      if (-1 < (int)(uVar23 + 3)) {
        uVar21 = uVar23 + 3;
      }
      local_5c8.m_data[1] = (local_6b8->m_attribute).m_data[uVar23 & 3];
      local_5c8.m_data[2] = (local_6b8->m_attribute).m_data[uVar23 + 1 & 3];
      local_5c8.m_data[3] =
           (local_6b8->m_attribute).m_data[(int)((uVar23 - (uVar20 & 0xfffffffc)) + 2)];
      local_5c8.m_data[0] =
           (local_6b8->m_attribute).m_data[(int)((uVar23 - (uVar21 & 0xfffffffc)) + 3)];
      local_528._4_4_ = local_5c8.m_data[2];
      local_528._0_4_ = local_5c8.m_data[1];
      local_520._4_4_ = local_5c8.m_data[0];
      local_520._0_4_ = local_5c8.m_data[3];
      local_5f0.m_data[1] = local_5c8.m_data[3];
      local_5f0.m_data[0] = local_5c8.m_data[2];
      local_5f0.m_data[3] = local_5c8.m_data[1];
      local_5f0.m_data[2] = local_5c8.m_data[0];
      local_5a8.m_data[1] = local_5c8.m_data[0];
      local_5a8.m_data[0] = local_5c8.m_data[3];
      local_5a8.m_data[3] = local_5c8.m_data[2];
      local_5a8.m_data[2] = local_5c8.m_data[1];
      OperatorPerformanceCase::AttribSpec::AttribSpec
                (&local_670,local_708._M_dataplus._M_p,(Vec4 *)local_528,&local_5f0,&local_5a8,
                 &local_5c8);
      std::
      vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
      ::push_back((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                   *)local_698,&local_670);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670.name._M_dataplus._M_p != &local_670.name.field_2) {
        operator_delete(local_670.name._M_dataplus._M_p,
                        local_670.name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_708._M_dataplus._M_p != &local_708.field_2) {
        operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
        operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 != local_6ac);
  }
  local_528 = (undefined1  [8])local_518;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"This is the program ","");
  std::__cxx11::string::append(local_528);
  std::operator+(&local_708," \'",local_608);
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_708);
  local_670.name._M_dataplus._M_p = (pointer)&local_670.name.field_2;
  psVar15 = (size_type *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_670.name.field_2._M_allocated_capacity = *psVar15;
    local_670.name.field_2._8_8_ = plVar11[3];
  }
  else {
    local_670.name.field_2._M_allocated_capacity = *psVar15;
    local_670.name._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_670.name._M_string_length = plVar11[1];
  *plVar11 = (long)psVar15;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  std::__cxx11::string::_M_append(local_528,(ulong)local_670.name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670.name._M_dataplus._M_p != &local_670.name.field_2) {
    operator_delete(local_670.name._M_dataplus._M_p,local_670.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708._M_dataplus._M_p != &local_708.field_2) {
    operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  OperatorPerformanceCase::ProgramContext::ProgramContext
            (local_3b0,&local_670.name,&local_708,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
              *)local_698,(string *)local_528);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708._M_dataplus._M_p != &local_708.field_2) {
    operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670.name._M_dataplus._M_p != &local_670.name.field_2) {
    operator_delete(local_670.name._M_dataplus._M_p,local_670.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_528 != (undefined1  [8])local_518) {
    operator_delete((void *)local_528,(ulong)(local_518._0_8_ + 1));
  }
  std::
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  ::~vector((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
             *)local_698);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  lVar17 = -0x60;
  plVar11 = local_348 + 2;
  do {
    if (plVar11 != (long *)plVar11[-2]) {
      operator_delete((long *)plVar11[-2],*plVar11 + 1);
    }
    plVar11 = plVar11 + -4;
    lVar17 = lVar17 + 0x20;
  } while (lVar17 != 0);
  pPVar12 = (ProgramContext *)local_578;
  if (local_588 != pPVar12) {
    operator_delete(local_588,(ulong)(local_578._0_8_ + 1));
    pPVar12 = extraout_RAX;
  }
  return pPVar12;
}

Assistant:

FunctionCase::ProgramContext FunctionCase::generateSingleProgramData (ProgramID programID) const
{
	const bool			isVertexCase			= m_caseType == CASETYPE_VERTEX;
	const char* const	precision				= glu::getPrecisionName(m_precision);
	const char* const	returnTypeName			= getDataTypeName(m_returnType);
	const string		returnPrecisionMaybe	= glu::isDataTypeBoolOrBVec(m_returnType) ? "" : string() + precision + " ";
	const char*			inputPrecision			= DE_NULL;
	const bool			isMatrixReturn			= isDataTypeMatrix(m_returnType);
	int					numParams				= 0;
	const char*			paramTypeNames[MAX_PARAMS];
	string				paramPrecisionsMaybe[MAX_PARAMS];

	for (int i = 0; i < MAX_PARAMS; i++)
	{
		paramTypeNames[i]			= getDataTypeName(m_paramTypes[i]);
		paramPrecisionsMaybe[i]		= glu::isDataTypeBoolOrBVec(m_paramTypes[i]) ? "" : string() + precision + " ";

		if (inputPrecision == DE_NULL && isDataTypeIntOrIVec(m_paramTypes[i]) && m_precision == glu::PRECISION_LOWP)
			inputPrecision = "mediump";

		if (m_paramTypes[i] != TYPE_INVALID)
			numParams = i+1;
	}

	DE_ASSERT(numParams > 0);

	if (inputPrecision == DE_NULL)
		inputPrecision = precision;

	int						numAttributes	= FUNCTION_CASE_NUM_INDEPENDENT_CALCULATIONS + numParams - 1;
	std::ostringstream		vtx;
	std::ostringstream		frag;
	std::ostringstream&		op				= isVertexCase ? vtx : frag;

	vtx << "#version 300 es\n";
	frag << "#version 300 es\n"
		 << "layout (location = 0) out mediump vec4 o_color;\n";

	// Attributes.
	vtx << "in highp vec4 a_position;\n";
	for (int i = 0; i < numAttributes; i++)
		vtx << "in " << inputPrecision << " vec4 a_in" << i << ";\n";

	if (isVertexCase)
	{
		vtx << "out mediump vec4 v_color;\n";
		frag << "in mediump vec4 v_color;\n";
	}
	else
	{
		for (int i = 0; i < numAttributes; i++)
		{
			vtx << "out " << inputPrecision << " vec4 v_in" << i << ";\n";
			frag << "in " << inputPrecision << " vec4 v_in" << i << ";\n";
		}
	}

	op << "uniform mediump int u_numLoopIterations;\n";
	if (isVertexCase)
		op << "uniform mediump float u_zero;\n";

	for (int paramNdx = 0; paramNdx < numParams; paramNdx++)
		op << "uniform " << paramPrecisionsMaybe[paramNdx] << paramTypeNames[paramNdx] << " u_inc" << (char)('A'+paramNdx) << ";\n";

	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";

	if (!isVertexCase)
		vtx << "\tgl_Position = a_position;\n";

	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";

	// Function call input and return value accumulation variables.
	{
		const char* const inPrefix = isVertexCase ? "a_" : "v_";

		for (int calcNdx = 0; calcNdx < FUNCTION_CASE_NUM_INDEPENDENT_CALCULATIONS; calcNdx++)
		{
			for (int paramNdx = 0; paramNdx < numParams; paramNdx++)
			{
				const glu::DataType		paramType	= m_paramTypes[paramNdx];
				const bool				mustCast	= paramType != glu::TYPE_FLOAT_VEC4;

				op << "\t" << paramPrecisionsMaybe[paramNdx] << paramTypeNames[paramNdx] << " in" << calcNdx << (char)('a'+paramNdx) << " = ";

				if (mustCast)
					op << paramTypeNames[paramNdx] << "(";

				if (glu::isDataTypeMatrix(paramType))
				{
					static const char* const	swizzles[3]		= { "x", "xy", "xyz" };
					const int					numRows			= glu::getDataTypeMatrixNumRows(paramType);
					const int					numCols			= glu::getDataTypeMatrixNumColumns(paramType);
					const string				swizzle			= numRows < 4 ? string() + "." + swizzles[numRows-1] : "";

					for (int i = 0; i < numCols; i++)
						op << (i > 0 ? ", " : "") << inPrefix << "in" << calcNdx+paramNdx << swizzle;
				}
				else
				{
					op << inPrefix << "in" << calcNdx+paramNdx;

					if (paramNdx == m_modifyParamNdx)
					{
						DE_ASSERT(glu::isDataTypeFloatOrVec(paramType));
						op << " + 2.0";
					}
				}

				if (mustCast)
					op << ")";

				op << ";\n";
			}

			op << "\t" << returnPrecisionMaybe << returnTypeName << " res" << calcNdx << " = " << returnTypeName << "(0);\n";
		}
	}

	// Loop with expressions in it.
	op << "\tfor (int i = 0; i < u_numLoopIterations; i++)\n";
	op << "\t{\n";
	for (int calcNdx = 0; calcNdx < FUNCTION_CASE_NUM_INDEPENDENT_CALCULATIONS; calcNdx++)
	{
		if (calcNdx > 0)
			op << "\n";

		op << "\t\t{\n";

		for (int inputNdx = 0; inputNdx < numParams; inputNdx++)
		{
			const string inputName	= "in" + de::toString(calcNdx) + (char)('a'+inputNdx);
			const string incName	= string() + "u_inc" + (char)('A'+inputNdx);
			const string incExpr	= incrementExpr(incName, m_paramTypes[inputNdx], m_useNearlyConstantInputs);

			op << "\t\t\t" << inputName << " = " << sumExpr(inputName, incExpr, m_paramTypes[inputNdx]) << ";\n";
		}

		op << "\t\t\t" << returnPrecisionMaybe << returnTypeName << " eval" << calcNdx << " = ";

		if (programID == PROGRAM_WITH_FUNCTION_CALLS)
		{
			op << m_func << "(";

			for (int paramNdx = 0; paramNdx < numParams; paramNdx++)
			{
				if (paramNdx > 0)
					op << ", ";

				op << "in" << calcNdx << (char)('a'+paramNdx);
			}

			op << ")";
		}
		else
		{
			DE_ASSERT(programID == PROGRAM_WITHOUT_FUNCTION_CALLS);
			op << returnTypeName << "(1)";
		}

		op << ";\n";

		{
			const string resName	= "res" + de::toString(calcNdx);
			const string evalName	= "eval" + de::toString(calcNdx);
			const string incExpr	= incrementExpr(evalName, m_returnType, m_useNearlyConstantInputs);

			op << "\t\t\tres" << calcNdx << " = " << sumExpr(resName, incExpr, m_returnType) << ";\n";
		}

		op << "\t\t}\n";
	}
	op << "\t}\n";
	op << "\n";

	// Result variables.
	for (int inputNdx = 0; inputNdx < numParams; inputNdx++)
	{
		op << "\t" << paramPrecisionsMaybe[inputNdx] << paramTypeNames[inputNdx] << " sumIn" << (char)('A'+inputNdx) << " = ";
		{
			string expr = string() + "in0" + (char)('a'+inputNdx);
			for (int i = 1; i < FUNCTION_CASE_NUM_INDEPENDENT_CALCULATIONS; i++)
				expr = sumExpr(expr, string() + "in" + de::toString(i) + (char)('a'+inputNdx), m_paramTypes[inputNdx]);
			op << expr;
		}
		op << ";\n";
	}

	op << "\t" << returnPrecisionMaybe << returnTypeName << " sumRes = ";
	{
		string expr = "res0";
		for (int i = 1; i < FUNCTION_CASE_NUM_INDEPENDENT_CALCULATIONS; i++)
			expr = sumExpr(expr, "res" + de::toString(i), m_returnType);
		op << expr;
	}
	op << ";\n";

	{
		glu::DataType finalResultDataType = glu::TYPE_LAST;

		if (glu::isDataTypeMatrix(m_returnType))
		{
			finalResultDataType = m_returnType;

			op << "\t" << precision << " " << returnTypeName << " finalRes = ";

			for (int inputNdx = 0; inputNdx < numParams; inputNdx++)
			{
				DE_ASSERT(m_paramTypes[inputNdx] == m_returnType);
				op << "sumIn" << (char)('A'+inputNdx) << " + ";
			}
			op << "sumRes;\n";
		}
		else
		{
			int numFinalResComponents = glu::getDataTypeScalarSize(m_returnType);
			for (int inputNdx = 0; inputNdx < numParams; inputNdx++)
				numFinalResComponents = de::max(numFinalResComponents, glu::getDataTypeScalarSize(m_paramTypes[inputNdx]));

			finalResultDataType = getDataTypeFloatOrVec(numFinalResComponents);

			{
				const string finalResType = glu::getDataTypeName(finalResultDataType);
				op << "\t" << precision << " " << finalResType << " finalRes = ";
				for (int inputNdx = 0; inputNdx < numParams; inputNdx++)
					op << finalResType << "(sumIn" << (char)('A'+inputNdx) << ") + ";
				op << finalResType << "(sumRes);\n";
			}
		}

		// Convert to color.
		op << "\tmediump vec4 color = ";
		if (finalResultDataType == TYPE_FLOAT_VEC4)
			op << "finalRes";
		else
		{
			int size = isMatrixReturn ? getDataTypeMatrixNumRows(finalResultDataType) : getDataTypeScalarSize(finalResultDataType);

			op << "vec4(";

			if (isMatrixReturn)
			{
				for (int i = 0; i < getDataTypeMatrixNumColumns(finalResultDataType); i++)
				{
					if (i > 0)
						op << " + ";
					op << "finalRes[" << i << "]";
				}
			}
			else
				op << "finalRes";

			for (int i = size; i < 4; i++)
				op << ", " << (i == 3 ? "1.0" : "0.0");

			op << ")";
		}
		op << ";\n";
		op << "\t" << (isVertexCase ? "v_color" : "o_color") << " = color;\n";

		if (isVertexCase)
		{
			vtx << "	gl_Position = a_position + u_zero*color;\n";
			frag << "	o_color = v_color;\n";
		}
		else
		{
			for (int i = 0; i < numAttributes; i++)
				vtx << "	v_in" << i << " = a_in" << i << ";\n";
		}

		vtx << "}\n";
		frag << "}\n";
	}

	{
		vector<AttribSpec> attributes;
		for (int i = 0; i < numAttributes; i++)
			attributes.push_back(AttribSpec(("a_in" + de::toString(i)).c_str(),
											m_attribute.swizzle((i+0)%4, (i+1)%4, (i+2)%4, (i+3)%4),
											m_attribute.swizzle((i+1)%4, (i+2)%4, (i+3)%4, (i+0)%4),
											m_attribute.swizzle((i+2)%4, (i+3)%4, (i+0)%4, (i+1)%4),
											m_attribute.swizzle((i+3)%4, (i+0)%4, (i+1)%4, (i+2)%4)));

		{
			string description = "This is the program ";

			description += programID == PROGRAM_WITHOUT_FUNCTION_CALLS	? "without"
						 : programID == PROGRAM_WITH_FUNCTION_CALLS		? "with"
						 : DE_NULL;

			description += " '" + m_func + "' function calls.\n"
						   "Note: workload size for this program means the number of loop iterations.";

			return ProgramContext(vtx.str(), frag.str(), attributes, description);
		}
	}
}